

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void gpu_register_built_in_renderers(void)

{
  GPU_RendererID id;
  GPU_RendererID id_00;
  GPU_RendererID id_01;
  GPU_RendererID id_02;
  GPU_RendererID id_03;
  GPU_RendererID local_80;
  GPU_RendererID local_68;
  GPU_RendererID local_50;
  GPU_RendererID local_38;
  GPU_RendererID local_20;
  
  GPU_MakeRendererID(&local_20,"OpenGL 1 BASE",1,1,1);
  id.renderer = local_20.renderer;
  id.major_version = local_20.major_version;
  id.name = local_20.name;
  id.minor_version = local_20.minor_version;
  id._20_4_ = local_20._20_4_;
  GPU_RegisterRenderer(id,GPU_CreateRenderer_OpenGL_1_BASE,GPU_FreeRenderer_OpenGL_1_BASE);
  GPU_MakeRendererID(&local_38,"OpenGL 1",2,1,1);
  id_00.renderer = local_38.renderer;
  id_00.major_version = local_38.major_version;
  id_00.name = local_38.name;
  id_00.minor_version = local_38.minor_version;
  id_00._20_4_ = local_38._20_4_;
  GPU_RegisterRenderer(id_00,GPU_CreateRenderer_OpenGL_1,GPU_FreeRenderer_OpenGL_1);
  GPU_MakeRendererID(&local_50,"OpenGL 2",3,2,0);
  id_01.renderer = local_50.renderer;
  id_01.major_version = local_50.major_version;
  id_01.name = local_50.name;
  id_01.minor_version = local_50.minor_version;
  id_01._20_4_ = local_50._20_4_;
  GPU_RegisterRenderer(id_01,GPU_CreateRenderer_OpenGL_2,GPU_FreeRenderer_OpenGL_2);
  GPU_MakeRendererID(&local_68,"OpenGL 3",4,3,0);
  id_02.renderer = local_68.renderer;
  id_02.major_version = local_68.major_version;
  id_02.name = local_68.name;
  id_02.minor_version = local_68.minor_version;
  id_02._20_4_ = local_68._20_4_;
  GPU_RegisterRenderer(id_02,GPU_CreateRenderer_OpenGL_3,GPU_FreeRenderer_OpenGL_3);
  GPU_MakeRendererID(&local_80,"OpenGL 4",5,4,0);
  id_03.renderer = local_80.renderer;
  id_03.major_version = local_80.major_version;
  id_03.name = local_80.name;
  id_03.minor_version = local_80.minor_version;
  id_03._20_4_ = local_80._20_4_;
  GPU_RegisterRenderer(id_03,GPU_CreateRenderer_OpenGL_4,GPU_FreeRenderer_OpenGL_4);
  return;
}

Assistant:

void gpu_register_built_in_renderers(void)
{
	#ifndef SDL_GPU_DISABLE_OPENGL
        #ifndef SDL_GPU_DISABLE_OPENGL_1_BASE
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 1 BASE", GPU_RENDERER_OPENGL_1_BASE, 1, 1),
                             &GPU_CreateRenderer_OpenGL_1_BASE,
                             &GPU_FreeRenderer_OpenGL_1_BASE);
        #endif
        
        #ifndef SDL_GPU_DISABLE_OPENGL_1
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 1", GPU_RENDERER_OPENGL_1, 1, 1),
                             &GPU_CreateRenderer_OpenGL_1,
                             &GPU_FreeRenderer_OpenGL_1);
        #endif
	
        #ifndef SDL_GPU_DISABLE_OPENGL_2
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 2", GPU_RENDERER_OPENGL_2, 2, 0),
                                 &GPU_CreateRenderer_OpenGL_2,
                                 &GPU_FreeRenderer_OpenGL_2);
        #endif
	
        #ifndef SDL_GPU_DISABLE_OPENGL_3
            #ifdef __MACOSX__
            // Depending on OS X version, it might only support core GL 3.3 or 3.2
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 2),
                                 &GPU_CreateRenderer_OpenGL_3,
                                 &GPU_FreeRenderer_OpenGL_3);
            #else
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 0),
                                 &GPU_CreateRenderer_OpenGL_3,
                                 &GPU_FreeRenderer_OpenGL_3);
            #endif
        #endif
	
        #ifndef SDL_GPU_DISABLE_OPENGL_4
            #ifdef __MACOSX__
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 1),
                                 &GPU_CreateRenderer_OpenGL_4,
                                 &GPU_FreeRenderer_OpenGL_4);
            #else
            GPU_RegisterRenderer(GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 0),
                                 &GPU_CreateRenderer_OpenGL_4,
                                 &GPU_FreeRenderer_OpenGL_4);
            #endif
        #endif
    #endif
	
	#ifndef SDL_GPU_DISABLE_GLES
        #ifndef SDL_GPU_DISABLE_GLES_1
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGLES 1", GPU_RENDERER_GLES_1, 1, 1),
                             &GPU_CreateRenderer_GLES_1,
                             &GPU_FreeRenderer_GLES_1);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_2
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGLES 2", GPU_RENDERER_GLES_2, 2, 0),
                             &GPU_CreateRenderer_GLES_2,
                             &GPU_FreeRenderer_GLES_2);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_3
        GPU_RegisterRenderer(GPU_MakeRendererID("OpenGLES 3", GPU_RENDERER_GLES_3, 3, 0),
                             &GPU_CreateRenderer_GLES_3,
                             &GPU_FreeRenderer_GLES_3);
        #endif
    #endif
	
}